

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.h
# Opt level: O2

EventMeta * rlib::midi::EventMeta::createTempo(EventMeta *__return_storage_ptr__,double tempo)

{
  initializer_list<unsigned_char> __l;
  allocator_type local_31;
  undefined4 local_30;
  uchar local_2b;
  undefined2 local_2a;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  local_30 = (undefined4)(long)(60000000.0 / tempo);
  std::__reverse<unsigned_char*>(&local_30);
  local_2b = local_30._1_1_;
  local_2a = local_30._2_2_;
  __l._M_len = 3;
  __l._M_array = &local_2b;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,__l,&local_31);
  (__return_storage_ptr__->super_Event)._vptr_Event = (_func_int **)&PTR__EventMeta_0016ccc0;
  __return_storage_ptr__->type = tempo;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = local_28._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = local_28._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_28._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

static EventMeta createTempo(double tempo) {
			union {
				uint8_t		buf[4] = { 0, };
				uint32_t	tempo;
			}t;
			assert(sizeof(t) == 4);
			t.tempo = static_cast<uint32_t>(60000000.0 / tempo);		// 4分音符の時間(microsec)
			std::reverse(reinterpret_cast<uint8_t*>(&t.tempo), reinterpret_cast<uint8_t*>(&t.tempo) + sizeof(t.tempo));		// エンディアン変更
			return EventMeta(Type::tempo, { t.buf[1], t.buf[2], t.buf[3] });
		}